

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

char * __thiscall IrSim::print2(IrSim *this,C_IC *i)

{
  size_t __maxlen;
  char *__format;
  char *pcVar1;
  string local_90;
  string local_70;
  string local_50;
  
  if ((i->arg1).kind != 0) {
    __maxlen = this->PBSIZE;
    pcVar1 = this->pb;
    if ((long)i->kind == 2) {
      Operand::str_abi_cxx11_(&local_70,&i->target);
      Operand::str_abi_cxx11_(&local_90,&OP_ZERO);
      Operand::str_abi_cxx11_(&local_50,&i->arg1);
      snprintf(pcVar1,__maxlen,"%s := %s - %s\n",local_70._M_dataplus._M_p,local_90._M_dataplus._M_p
               ,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      __format = icFmt[i->kind];
      Operand::str_abi_cxx11_(&local_70,&i->target);
      Operand::str_abi_cxx11_(&local_90,&i->arg1);
      snprintf(pcVar1,__maxlen,__format,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    return this->pb;
  }
  pcVar1 = print1(this,i);
  return pcVar1;
}

Assistant:

const char *IrSim::print2(C_IC &i) const {
    if (i.arg1.kind == IR_NONE) return print1(i);
    if (i.kind == IC_SUB)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), OP_ZERO.str().c_str(), i[1].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str());
    return pb;
}